

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::LE_Fire_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,LE_Fire_PDU *this)

{
  ostream *poVar1;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  LE_Fire_PDU *local_18;
  LE_Fire_PDU *this_local;
  
  local_18 = this;
  this_local = (LE_Fire_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  LE_Header::GetAsString_abi_cxx11_(&local_1c0,&this->super_LE_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-LE Fire PDU-\n");
  poVar1 = std::operator<<(poVar1,"Optional Field Flags:\n");
  poVar1 = std::operator<<(poVar1,"\tTarget ID:                            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tMunition ID:                          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tMunition Site & Application Included: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tEvent Site & Application Included:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag >> 3 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tWarhead & Fuse Included:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag >> 4 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tQuantity & Rate Included:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag >> 5 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLocation:                             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FireFlagUnion).m_ui8Flag >> 6 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  if (((this->m_FireFlagUnion).m_ui8Flag & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Target ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_TargetID);
    std::operator<<(poVar1,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  if (((this->m_FireFlagUnion).m_ui8Flag >> 2 & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Munition ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_MunitionID);
    std::operator<<(poVar1,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  poVar1 = std::operator<<(local_190,"Event ID: ");
  DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_EventID);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_(&local_250,&this->m_MunitionDesc);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_270,&this->m_Loc);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"Velocity: ");
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_290,&this->m_Vel);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"Range: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Range);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-LE Fire PDU-\n"
       << "Optional Field Flags:\n"
       << "\tTarget ID:                            " << ( KUINT16 )m_FireFlagUnion.m_ui8TargetId         << "\n"
       << "\tMunition ID:                          " << ( KUINT16 )m_FireFlagUnion.m_ui8MunitionId       << "\n"
       << "\tMunition Site & Application Included: " << ( KUINT16 )m_FireFlagUnion.m_ui8MunitionSiteApp  << "\n"
       << "\tEvent Site & Application Included:    " << ( KUINT16 )m_FireFlagUnion.m_ui8EventSiteAppId   << "\n"
       << "\tWarhead & Fuse Included:              " << ( KUINT16 )m_FireFlagUnion.m_ui8WarheadFuse      << "\n"
       << "\tQuantity & Rate Included:             " << ( KUINT16 )m_FireFlagUnion.m_ui8QuantRate        << "\n"
       << "\tLocation:                             " << ( KUINT16 )m_FireFlagUnion.m_ui8Location         << "\n";

    if( m_FireFlagUnion.m_ui8TargetId )
    {
        ss << "Target ID: " << m_TargetID.GetAsString();
    }

    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        ss << "Munition ID: " << m_MunitionID.GetAsString();
    }

    ss << "Event ID: " << m_EventID.GetAsString()
       << m_MunitionDesc.GetAsString()
       << m_Loc.GetAsString()
       << "Velocity: " << m_Vel.GetAsString()
       << "Range: " << m_ui16Range
       << "\n";

    return ss.str();
}